

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O2

void google::protobuf::internal::MapFieldBase::SwapPayload(MapFieldBase *lhs,MapFieldBase *rhs)

{
  State SVar1;
  TaggedPtr TVar2;
  Arena *pAVar3;
  Arena *pAVar4;
  ReflectionPayload *this;
  ReflectionPayload *other;
  
  pAVar3 = arena(lhs);
  pAVar4 = arena(rhs);
  if (pAVar3 == pAVar4) {
    TVar2 = (rhs->super_MapFieldBaseForParse).payload_._M_i;
    (rhs->super_MapFieldBaseForParse).payload_._M_i =
         (lhs->super_MapFieldBaseForParse).payload_._M_i;
    (lhs->super_MapFieldBaseForParse).payload_._M_i = TVar2;
  }
  else {
    this = maybe_payload(lhs);
    other = maybe_payload(rhs);
    if (this != (ReflectionPayload *)0x0 || other != (ReflectionPayload *)0x0) {
      if (this == (ReflectionPayload *)0x0) {
        this = payload(lhs);
      }
      if (other == (ReflectionPayload *)0x0) {
        other = payload(rhs);
      }
      RepeatedPtrField<google::protobuf::Message>::Swap
                (&this->repeated_field,&other->repeated_field);
      SVar1 = (other->state)._M_i;
      (other->state)._M_i = (this->state)._M_i;
      (this->state)._M_i = SVar1;
    }
  }
  return;
}

Assistant:

void MapFieldBase::SwapPayload(MapFieldBase& lhs, MapFieldBase& rhs) {
  if (lhs.arena() == rhs.arena()) {
    SwapRelaxed(lhs.payload_, rhs.payload_);
    return;
  }
  auto* p1 = lhs.maybe_payload();
  auto* p2 = rhs.maybe_payload();
  if (p1 == nullptr && p2 == nullptr) return;

  if (p1 == nullptr) p1 = &lhs.payload();
  if (p2 == nullptr) p2 = &rhs.payload();
  p1->repeated_field.Swap(&p2->repeated_field);
  SwapRelaxed(p1->state, p2->state);
}